

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
diligent_spirv_cross::CompilerGLSL::replace_fragment_output(CompilerGLSL *this,SPIRVariable *var)

{
  size_t sVar1;
  mapped_type *this_00;
  SPIRType *pSVar2;
  CompilerError *this_01;
  char (*in_R8) [2];
  uint32_t location;
  uint32_t local_44;
  string local_40;
  
  this_00 = ::std::__detail::
            _Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&(this->super_Compiler).ir.meta,&(var->super_IVariant).self);
  local_44 = 0;
  if (((this_00->decoration).decoration_flags.lower & 0x40000000) != 0) {
    local_44 = (this_00->decoration).location;
  }
  pSVar2 = Variant::get<diligent_spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<diligent_spirv_cross::Variant>.
                      ptr + *(uint *)&(var->super_IVariant).field_0xc);
  sVar1 = (pSVar2->array).super_VectorView<unsigned_int>.buffer_size;
  if (sVar1 == 1) {
    ::std::__cxx11::string::_M_replace
              ((ulong)this_00,0,(char *)(this_00->decoration).alias._M_string_length,0x85dc5b);
    if (local_44 != 0) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,
                 "Arrayed output variable used, but location is not 0. This is unimplemented in SPIRV-Cross."
                );
      goto LAB_007489f1;
    }
    if (((this->options).es != true) || (299 < (this->options).version)) goto LAB_007489a7;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GL_EXT_draw_buffers","");
    require_extension_internal(this,&local_40);
  }
  else {
    if (sVar1 != 0) {
      this_01 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_01,
                 "Array-of-array output variable used. This cannot be implemented in legacy GLSL.");
LAB_007489f1:
      __cxa_throw(this_01,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    join<char_const(&)[13],unsigned_int&,char_const(&)[2]>
              (&local_40,(diligent_spirv_cross *)"gl_FragData[",(char (*) [13])&local_44,
               (uint *)0x8bf931,in_R8);
    ::std::__cxx11::string::operator=((string *)this_00,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    if ((((this->options).es != true) || (299 < (this->options).version)) || (local_44 == 0))
    goto LAB_007489a7;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"GL_EXT_draw_buffers","");
    require_extension_internal(this,&local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
LAB_007489a7:
  var->compat_builtin = true;
  return;
}

Assistant:

void CompilerGLSL::replace_fragment_output(SPIRVariable &var)
{
	auto &m = ir.meta[var.self].decoration;
	uint32_t location = 0;
	if (m.decoration_flags.get(DecorationLocation))
		location = m.location;

	// If our variable is arrayed, we must not emit the array part of this as the SPIR-V will
	// do the access chain part of this for us.
	auto &type = get<SPIRType>(var.basetype);

	if (type.array.empty())
	{
		// Redirect the write to a specific render target in legacy GLSL.
		m.alias = join("gl_FragData[", location, "]");

		if (is_legacy_es() && location != 0)
			require_extension_internal("GL_EXT_draw_buffers");
	}
	else if (type.array.size() == 1)
	{
		// If location is non-zero, we probably have to add an offset.
		// This gets really tricky since we'd have to inject an offset in the access chain.
		// FIXME: This seems like an extremely odd-ball case, so it's probably fine to leave it like this for now.
		m.alias = "gl_FragData";
		if (location != 0)
			SPIRV_CROSS_THROW("Arrayed output variable used, but location is not 0. "
			                  "This is unimplemented in SPIRV-Cross.");

		if (is_legacy_es())
			require_extension_internal("GL_EXT_draw_buffers");
	}
	else
		SPIRV_CROSS_THROW("Array-of-array output variable used. This cannot be implemented in legacy GLSL.");

	var.compat_builtin = true; // We don't want to declare this variable, but use the name as-is.
}